

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

UVec4 __thiscall tcu::getFormatMaxUintValue(tcu *this,TextureFormat *format)

{
  ChannelOrder CVar1;
  ChannelType CVar2;
  uint *puVar3;
  uint *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  UVec4 UVar9;
  
  CVar1 = format->order;
  CVar2 = format->type;
  puVar3 = (uint *)(ulong)CONCAT31((int3)(CVar1 >> 8),
                                   (CVar1 == BGRA || CVar1 == RGBA) &&
                                   CVar2 == UNSIGNED_INT_1010102_REV);
  if ((CVar1 == BGRA || CVar1 == RGBA) && CVar2 == UNSIGNED_INT_1010102_REV) {
    uVar5 = 0x3ff;
    uVar6 = 0x3ff;
    uVar7 = 0x3ff;
    uVar8 = 3;
    puVar4 = puVar3;
  }
  else {
    puVar4 = &switchD_019adf8a::switchdataD_01cca4c0;
    switch(CVar2) {
    case UNSIGNED_INT8:
      uVar5 = 0xff;
      uVar6 = 0xff;
      uVar7 = 0xff;
      uVar8 = 0xff;
      break;
    case UNSIGNED_INT16:
      uVar5 = 0xffff;
      uVar6 = 0xffff;
      uVar7 = 0xffff;
      uVar8 = 0xffff;
      break;
    case UNSIGNED_INT24:
      uVar5 = 0xffffff;
      uVar6 = 0xffffff;
      uVar7 = 0xffffff;
      uVar8 = 0xffffff;
      break;
    case UNSIGNED_INT32:
      uVar7 = 0xffffffff;
      uVar5 = 0xffffffff;
      uVar6 = 0xffffffff;
      uVar8 = 0xffffffff;
      break;
    default:
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      puVar4 = puVar3;
    }
  }
  *(undefined4 *)this = uVar5;
  *(undefined4 *)(this + 4) = uVar6;
  *(undefined4 *)(this + 8) = uVar7;
  *(undefined4 *)(this + 0xc) = uVar8;
  UVar9.m_data._8_8_ = puVar4;
  UVar9.m_data._0_8_ = this;
  return (UVec4)UVar9.m_data;
}

Assistant:

UVec4 getFormatMaxUintValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::UNSIGNED_INT_1010102_REV))
		return UVec4(1023u, 1023u, 1023u, 3u);

	switch (format.type)
	{
		case TextureFormat::UNSIGNED_INT8:	return UVec4(std::numeric_limits<deUint8>::max());
		case TextureFormat::UNSIGNED_INT16:	return UVec4(std::numeric_limits<deUint16>::max());
		case TextureFormat::UNSIGNED_INT24:	return UVec4(0xffffffu);
		case TextureFormat::UNSIGNED_INT32:	return UVec4(std::numeric_limits<deUint32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return UVec4(0);
	}
}